

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O1

Mat * __thiscall
ncnn::ModelBinFromStdio::load(Mat *__return_storage_ptr__,ModelBinFromStdio *this,int w,int type)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  ModelBinFromStdio *pMVar6;
  char *pcVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  pointer __ptr;
  size_t sVar11;
  size_type __new_size;
  pointer puVar12;
  anon_union_4_2_77b30072 flag_struct;
  Mat m;
  vector<unsigned_char,_std::allocator<unsigned_char>_> index_array;
  vector<unsigned_short,_std::allocator<unsigned_short>_> float16_weights;
  uint local_4a8;
  uint local_4a4;
  undefined8 local_4a0;
  pointer local_498;
  undefined8 uStack_490;
  undefined4 uStack_488;
  undefined4 uStack_484;
  int iStack_480;
  Allocator *local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  size_t sStack_460;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_458;
  vector<signed_char,_std::allocator<signed_char>_> local_438 [43];
  
  if ((FILE *)this->binfp == (FILE *)0x0) {
    *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    goto LAB_0015979b;
  }
  if (type == 1) {
    pMVar6 = (ModelBinFromStdio *)(long)w;
    if (w == 0) {
      __ptr = (pointer)0x0;
      puVar12 = (pointer)0x0;
    }
    else {
      local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_4a0 = this;
      iVar4 = posix_memalign((void **)local_438,0x10,(long)pMVar6 * 4 + 4);
      if (iVar4 != 0) {
        local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
      }
      puVar12 = (pointer)((long)local_438[0].
                                super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                _M_impl.super__Vector_impl_data._M_start + (long)pMVar6 * 2 * 2);
      ((pointer)
      ((long)local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_start + (long)pMVar6 * 2 * 2))[0] = 1;
      ((pointer)
      ((long)local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_start + (long)pMVar6 * 2 * 2))[1] = 0;
      __ptr = (pointer)local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
      this = local_4a0;
    }
LAB_001599c5:
    if ((__ptr == (pointer)0x0 || w == 0) ||
       (sVar5 = fread(__ptr,(long)pMVar6 * 4,1,(FILE *)this->binfp), (int)sVar5 == 1)) {
      __return_storage_ptr__->data = __ptr;
      __return_storage_ptr__->refcount = (int *)puVar12;
      __return_storage_ptr__->elemsize = 4;
      __return_storage_ptr__->packing = 1;
      __return_storage_ptr__->allocator = (Allocator *)0x0;
      __return_storage_ptr__->dims = 1;
      __return_storage_ptr__->w = w;
      __return_storage_ptr__->h = 1;
      __return_storage_ptr__->c = 1;
      __return_storage_ptr__->cstep = (size_t)pMVar6;
      if (puVar12 == (pointer)0x0) {
        return __return_storage_ptr__;
      }
      LOCK();
      *(int *)puVar12 = *(int *)puVar12 + 1;
      UNLOCK();
    }
    else {
      fprintf(_stderr,"ModelBin read weight_data failed %d\n",sVar5 & 0xffffffff);
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
      __return_storage_ptr__->allocator = (Allocator *)0x0;
      __return_storage_ptr__->dims = 0;
      __return_storage_ptr__->w = 0;
      __return_storage_ptr__->h = 0;
      __return_storage_ptr__->c = 0;
      __return_storage_ptr__->cstep = 0;
    }
    if (puVar12 == (pointer)0x0) {
      return __return_storage_ptr__;
    }
    LOCK();
    *(int *)puVar12 = *(int *)puVar12 + -1;
    UNLOCK();
    if (__ptr == (pointer)0x0 || *(int *)puVar12 != 0) {
      return __return_storage_ptr__;
    }
    free(__ptr);
    return __return_storage_ptr__;
  }
  if (type == 0) {
    sVar5 = fread(&local_4a8,4,1,(FILE *)this->binfp);
    if ((int)sVar5 == 1) {
      if (local_4a8 == 0x2c056) {
        pMVar6 = (ModelBinFromStdio *)(long)w;
        if (w == 0) {
          puVar12 = (pointer)0x0;
          __ptr = (pointer)0x0;
        }
        else {
          local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_4a0 = pMVar6;
          iVar4 = posix_memalign((void **)local_438,0x10,(long)pMVar6 * 4 + 4);
          if (iVar4 != 0) {
            local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
          }
          puVar12 = (pointer)((long)local_438[0].
                                    super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                    _M_impl.super__Vector_impl_data._M_start + (long)pMVar6 * 2 * 2)
          ;
          ((pointer)
          ((long)local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_start + (long)pMVar6 * 2 * 2))[0] = 1;
          ((pointer)
          ((long)local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_start + (long)pMVar6 * 2 * 2))[1] = 0;
          pMVar6 = local_4a0;
          __ptr = (pointer)local_438[0].
                           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                           super__Vector_impl_data._M_start;
        }
        goto LAB_001599c5;
      }
      if (local_4a8 == 0xd4b38) {
        local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar10 = (long)(w + 3) & 0xfffffffffffffffc;
        std::vector<signed_char,_std::allocator<signed_char>_>::resize(local_438,uVar10);
        sVar5 = fread(local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,uVar10,1,(FILE *)this->binfp);
        uVar3 = (uint)sVar5;
        if (uVar3 == 1) {
          sVar5 = (size_t)w;
          *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
          *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
          __return_storage_ptr__->data = (void *)0x0;
          __return_storage_ptr__->refcount = (int *)0x0;
          __return_storage_ptr__->allocator = (Allocator *)0x0;
          __return_storage_ptr__->dims = 0;
          __return_storage_ptr__->w = 0;
          __return_storage_ptr__->h = 0;
          __return_storage_ptr__->c = 0;
          __return_storage_ptr__->cstep = 0;
          if ((((__return_storage_ptr__->dims != 1) || (__return_storage_ptr__->w != w)) ||
              (__return_storage_ptr__->elemsize != 1)) ||
             ((__return_storage_ptr__->packing != 1 ||
              (__return_storage_ptr__->allocator != (Allocator *)0x0)))) {
            piVar1 = __return_storage_ptr__->refcount;
            if (piVar1 != (int *)0x0) {
              LOCK();
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (*piVar1 == 0) {
                if (__return_storage_ptr__->allocator == (Allocator *)0x0) {
                  if (__return_storage_ptr__->data != (void *)0x0) {
                    free(__return_storage_ptr__->data);
                  }
                }
                else {
                  (**(code **)(*(long *)__return_storage_ptr__->allocator + 0x18))();
                }
              }
            }
            *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
            *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
            __return_storage_ptr__->data = (void *)0x0;
            __return_storage_ptr__->refcount = (int *)0x0;
            __return_storage_ptr__->cstep = 0;
            __return_storage_ptr__->dims = 0;
            __return_storage_ptr__->w = 0;
            __return_storage_ptr__->h = 0;
            __return_storage_ptr__->c = 0;
            __return_storage_ptr__->elemsize = 1;
            __return_storage_ptr__->packing = 1;
            __return_storage_ptr__->allocator = (Allocator *)0x0;
            __return_storage_ptr__->dims = 1;
            __return_storage_ptr__->w = w;
            __return_storage_ptr__->h = 1;
            __return_storage_ptr__->c = 1;
            __return_storage_ptr__->cstep = sVar5;
            if (w != 0) {
              uVar10 = sVar5 + 3 & 0xfffffffffffffffc;
              local_498 = (pointer)0x0;
              iVar4 = posix_memalign(&local_498,0x10,uVar10 + 4);
              if (iVar4 != 0) {
                local_498 = (pointer)0x0;
              }
              __return_storage_ptr__->data = local_498;
              __return_storage_ptr__->refcount = (int *)((long)local_498 + uVar10);
              *(undefined4 *)((long)local_498 + uVar10) = 1;
            }
          }
          if ((__return_storage_ptr__->data != (void *)0x0) &&
             ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep != 0)) {
            memcpy(__return_storage_ptr__->data,
                   local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,sVar5);
          }
          goto LAB_00159e60;
        }
        pcVar7 = "ModelBin read int8_weights failed %d\n";
      }
      else {
        if (local_4a8 != 0x1306b47) {
          uVar3 = local_4a8 >> 8;
          uVar2 = local_4a8 >> 0x18;
          local_498 = (pointer)0x0;
          uStack_490._0_4_ = 0;
          uStack_490._4_4_ = 0;
          uStack_490 = (pointer)0x0;
          uStack_488 = 4;
          uStack_484 = 0;
          iStack_480 = 1;
          local_478 = (Allocator *)0x0;
          uStack_470 = CONCAT44(w,1);
          local_468 = 0x100000001;
          sVar11 = (size_t)w;
          uVar8 = local_4a8 & 0xff;
          uVar9 = local_4a8 >> 0x10 & 0xff;
          sStack_460 = sVar11;
          if (w != 0) {
            local_4a0 = (ModelBinFromStdio *)
                        (CONCAT44(local_4a0._4_4_,local_4a8 >> 0x10) & 0xffffffff000000ff);
            local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_4a4 = local_4a8 & 0xff;
            iVar4 = posix_memalign((void **)local_438,0x10,sVar11 * 4 + 4);
            if (iVar4 != 0) {
              local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
            }
            local_498 = (pointer)local_438[0].
                                 super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start;
            uStack_490 = (pointer)((long)local_438[0].
                                         super__Vector_base<signed_char,_std::allocator<signed_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start + sVar11 * 2 * 2)
            ;
            ((pointer)
            ((long)local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                   _M_impl.super__Vector_impl_data._M_start + sVar11 * 2 * 2))[0] = 1;
            ((pointer)
            ((long)local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                   _M_impl.super__Vector_impl_data._M_start + sVar11 * 2 * 2))[1] = 0;
            uVar8 = local_4a4;
            uVar9 = (uint)local_4a0;
          }
          if ((local_498 == (pointer)0x0) || ((long)local_468._4_4_ * sStack_460 == 0)) {
            __return_storage_ptr__->data = local_498;
          }
          else {
            if ((uVar3 & 0xff) + uVar8 + uVar9 == 0 && uVar2 == 0) {
              if ((char)local_4a8 == '\0') {
                sVar5 = fread(local_498,(long)w << 2,1,(FILE *)this->binfp);
                uVar3 = (uint)sVar5;
                if (uVar3 != 1) {
                  pcVar7 = "ModelBin read weight_data failed %d\n";
                  goto LAB_00159ea0;
                }
              }
            }
            else {
              sVar5 = fread(local_438,0x400,1,(FILE *)this->binfp);
              uVar3 = (uint)sVar5;
              if (uVar3 != 1) {
                pcVar7 = "ModelBin read quantization_value failed %d\n";
LAB_00159ea0:
                fprintf(_stderr,pcVar7,(ulong)uVar3);
                __return_storage_ptr__->data = (void *)0x0;
                __return_storage_ptr__->refcount = (int *)0x0;
                *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
                *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
                __return_storage_ptr__->allocator = (Allocator *)0x0;
                __return_storage_ptr__->dims = 0;
                __return_storage_ptr__->w = 0;
                __return_storage_ptr__->h = 0;
                __return_storage_ptr__->c = 0;
                __return_storage_ptr__->cstep = 0;
                goto LAB_00159d4e;
              }
              local_458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              __new_size = (size_type)(int)(w + 3U & 0xfffffffc);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        (&local_458,__new_size);
              sVar5 = fread(local_458.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,__new_size,1,
                            (FILE *)this->binfp);
              if ((int)sVar5 == 1) {
                if (0 < w) {
                  uVar10 = 0;
                  do {
                    *(undefined4 *)(local_498 + uVar10 * 2) =
                         *(undefined4 *)
                          ((long)&local_438[0].
                                  super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start +
                          (ulong)local_458.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar10] * 4);
                    uVar10 = uVar10 + 1;
                  } while ((uint)w != uVar10);
                }
              }
              else {
                fprintf(_stderr,"ModelBin read index_array failed %d\n",sVar5 & 0xffffffff);
                __return_storage_ptr__->data = (void *)0x0;
                __return_storage_ptr__->refcount = (int *)0x0;
                *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
                *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
                __return_storage_ptr__->allocator = (Allocator *)0x0;
                __return_storage_ptr__->dims = 0;
                __return_storage_ptr__->w = 0;
                __return_storage_ptr__->h = 0;
                __return_storage_ptr__->c = 0;
                __return_storage_ptr__->cstep = 0;
              }
              if (local_458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_458.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_458.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_458.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if ((int)sVar5 != 1) goto LAB_00159d4e;
            }
            __return_storage_ptr__->data = local_498;
          }
          __return_storage_ptr__->refcount = (int *)uStack_490;
          __return_storage_ptr__->elemsize = CONCAT44(uStack_484,uStack_488);
          __return_storage_ptr__->packing = iStack_480;
          __return_storage_ptr__->allocator = local_478;
          __return_storage_ptr__->dims = (undefined4)uStack_470;
          __return_storage_ptr__->w = uStack_470._4_4_;
          __return_storage_ptr__->h = (undefined4)local_468;
          __return_storage_ptr__->c = local_468._4_4_;
          __return_storage_ptr__->cstep = sStack_460;
          if (uStack_490 != (pointer)0x0) {
            LOCK();
            *(int *)uStack_490 = *(int *)uStack_490 + 1;
            UNLOCK();
          }
LAB_00159d4e:
          if (uStack_490 == (pointer)0x0) {
            return __return_storage_ptr__;
          }
          LOCK();
          *(int *)uStack_490 = *(int *)uStack_490 + -1;
          UNLOCK();
          if (*(int *)uStack_490 != 0) {
            return __return_storage_ptr__;
          }
          if (local_478 != (Allocator *)0x0) {
            (**(code **)(*(long *)local_478 + 0x18))();
            return __return_storage_ptr__;
          }
          if (local_498 == (pointer)0x0) {
            return __return_storage_ptr__;
          }
          free(local_498);
          return __return_storage_ptr__;
        }
        local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar10 = (long)(((ulong)(uint)w << 0x21) + 0x300000000) >> 0x20 & 0xfffffffffffffffc;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_438,uVar10);
        sVar5 = fread(local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,uVar10,1,(FILE *)this->binfp);
        uVar3 = (uint)sVar5;
        if (uVar3 == 1) {
          Mat::from_float16(__return_storage_ptr__,
                            (unsigned_short *)
                            local_438[0].
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                            super__Vector_impl_data._M_start,w);
          goto LAB_00159e60;
        }
        pcVar7 = "ModelBin read float16_weights failed %d\n";
      }
      fprintf(_stderr,pcVar7,(ulong)uVar3);
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
      __return_storage_ptr__->allocator = (Allocator *)0x0;
      __return_storage_ptr__->dims = 0;
      __return_storage_ptr__->w = 0;
      __return_storage_ptr__->h = 0;
      __return_storage_ptr__->c = 0;
      __return_storage_ptr__->cstep = 0;
LAB_00159e60:
      if ((unsigned_short *)
          local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start == (unsigned_short *)0x0) {
        return __return_storage_ptr__;
      }
      operator_delete(local_438[0].super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_438[0].
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_438[0].
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                            super__Vector_impl_data._M_start);
      return __return_storage_ptr__;
    }
    pcVar7 = "ModelBin read flag_struct failed %d\n";
    uVar10 = sVar5 & 0xffffffff;
  }
  else {
    pcVar7 = "ModelBin load type %d not implemented\n";
    uVar10 = (ulong)(uint)type;
  }
  fprintf(_stderr,pcVar7,uVar10);
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->refcount = (int *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
LAB_0015979b:
  __return_storage_ptr__->allocator = (Allocator *)0x0;
  __return_storage_ptr__->dims = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->h = 0;
  __return_storage_ptr__->c = 0;
  __return_storage_ptr__->cstep = 0;
  return __return_storage_ptr__;
}

Assistant:

Mat ModelBinFromStdio::load(int w, int type) const
{
    if (!binfp)
        return Mat();

    if (type == 0)
    {
        int nread;

        union
        {
            struct
            {
                unsigned char f0;
                unsigned char f1;
                unsigned char f2;
                unsigned char f3;
            };
            unsigned int tag;
        } flag_struct;

        nread = fread(&flag_struct, sizeof(flag_struct), 1, binfp);
        if (nread != 1)
        {
            fprintf(stderr, "ModelBin read flag_struct failed %d\n", nread);
            return Mat();
        }

        unsigned int flag = flag_struct.f0 + flag_struct.f1 + flag_struct.f2 + flag_struct.f3;

        if (flag_struct.tag == 0x01306B47)
        {
            // half-precision data
            int align_data_size = alignSize(w * sizeof(unsigned short), 4);
            std::vector<unsigned short> float16_weights;
            float16_weights.resize(align_data_size);
            nread = fread(float16_weights.data(), align_data_size, 1, binfp);
            if (nread != 1)
            {
                fprintf(stderr, "ModelBin read float16_weights failed %d\n", nread);
                return Mat();
            }

            return Mat::from_float16(float16_weights.data(), w);
        }
        else if (flag_struct.tag == 0x000D4B38)
        {
            // int8 data
            int align_data_size = alignSize(w, 4);
            std::vector<signed char> int8_weights;
            int8_weights.resize(align_data_size);
            nread = fread(int8_weights.data(), align_data_size, 1, binfp);
            if (nread != 1)
            {
                fprintf(stderr, "ModelBin read int8_weights failed %d\n", nread);
                return Mat();
            }

            Mat m(w, (size_t)1u);
            if (m.empty())
                return m;

            memcpy(m.data, int8_weights.data(), w);

            return m;
        }
        else if (flag_struct.tag == 0x0002C056)
        {
            Mat m(w);
            if (m.empty())
                return m;

            // raw data with extra scaling
            nread = fread(m, w * sizeof(float), 1, binfp);
            if (nread != 1)
            {
                fprintf(stderr, "ModelBin read weight_data failed %d\n", nread);
                return Mat();
            }

            return m;
        }

        Mat m(w);
        if (m.empty())
            return m;

        if (flag != 0)
        {
            // quantized data
            float quantization_value[256];
            nread = fread(quantization_value, 256 * sizeof(float), 1, binfp);
            if (nread != 1)
            {
                fprintf(stderr, "ModelBin read quantization_value failed %d\n", nread);
                return Mat();
            }

            int align_weight_data_size = alignSize(w * sizeof(unsigned char), 4);
            std::vector<unsigned char> index_array;
            index_array.resize(align_weight_data_size);
            nread = fread(index_array.data(), align_weight_data_size, 1, binfp);
            if (nread != 1)
            {
                fprintf(stderr, "ModelBin read index_array failed %d\n", nread);
                return Mat();
            }

            float* ptr = m;
            for (int i = 0; i < w; i++)
            {
                ptr[i] = quantization_value[ index_array[i] ];
            }
        }
        else if (flag_struct.f0 == 0)
        {
            // raw data
            nread = fread(m, w * sizeof(float), 1, binfp);
            if (nread != 1)
            {
                fprintf(stderr, "ModelBin read weight_data failed %d\n", nread);
                return Mat();
            }
        }

        return m;
    }
    else if (type == 1)
    {
        Mat m(w);
        if (m.empty())
            return m;

        // raw data
        int nread = fread(m, w * sizeof(float), 1, binfp);
        if (nread != 1)
        {
            fprintf(stderr, "ModelBin read weight_data failed %d\n", nread);
            return Mat();
        }

        return m;
    }
    else
    {
        fprintf(stderr, "ModelBin load type %d not implemented\n", type);
        return Mat();
    }

    return Mat();
}